

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O3

void opj_mqc_erterm_enc(opj_mqc_t *mqc)

{
  bool bVar1;
  OPJ_UINT32 OVar2;
  int iVar3;
  int iVar4;
  
  OVar2 = mqc->ct;
  iVar3 = 0xc - OVar2;
  if (0 < (int)(0xc - OVar2)) {
    do {
      mqc->c = mqc->c << ((byte)OVar2 & 0x1f);
      mqc->ct = 0;
      opj_mqc_byteout(mqc);
      OVar2 = mqc->ct;
      iVar4 = iVar3 - OVar2;
      bVar1 = (int)OVar2 <= iVar3;
      iVar3 = iVar4;
    } while (iVar4 != 0 && bVar1);
  }
  if (*mqc->bp != 0xff) {
    opj_mqc_byteout(mqc);
    return;
  }
  return;
}

Assistant:

void opj_mqc_erterm_enc(opj_mqc_t *mqc)
{
    OPJ_INT32 k = (OPJ_INT32)(11 - mqc->ct + 1);

    while (k > 0) {
        mqc->c <<= mqc->ct;
        mqc->ct = 0;
        opj_mqc_byteout(mqc);
        k -= (OPJ_INT32)mqc->ct;
    }

    if (*mqc->bp != 0xff) {
        opj_mqc_byteout(mqc);
    }
}